

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::set_delay(NaPNDelay *this,uint nDim,uint *piMap)

{
  undefined1 auVar1 [16];
  undefined4 *puVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  uint i;
  uint local_1c;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14bec1);
  *(undefined4 *)(in_RDI + 0x1c8) = in_ESI;
  if (*(void **)(in_RDI + 0x1c0) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x1c0),4);
  }
  if (*(int *)(in_RDI + 0x1c8) == 0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 3;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  if (in_RDX == 0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)(in_RDI + 0x1c8);
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RDI + 0x1c0) = pvVar4;
  *(undefined4 *)(in_RDI + 400) = 0;
  *(undefined4 *)(in_RDI + 0x194) = 0;
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x1c8); local_1c = local_1c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_1c * 4) =
         *(undefined4 *)(in_RDX + (ulong)local_1c * 4);
    if (*(uint *)(in_RDI + 400) < *(uint *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_1c * 4)) {
      *(undefined4 *)(in_RDI + 400) =
           *(undefined4 *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_1c * 4);
    }
    if (local_1c == 0) {
      *(undefined4 *)(in_RDI + 0x194) = **(undefined4 **)(in_RDI + 0x1c0);
    }
    if (*(uint *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_1c * 4) < *(uint *)(in_RDI + 0x194)) {
      *(undefined4 *)(in_RDI + 0x194) =
           *(undefined4 *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_1c * 4);
    }
  }
  return;
}

Assistant:

void
NaPNDelay::set_delay (unsigned nDim, unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete piOutMap;

  if(0 == nOutDim)
    throw(na_bad_value);
  else if(NULL == piMap)
    throw(na_null_pointer);

  piOutMap = new unsigned[nOutDim];
  nMaxLag = 0;
  nMinLag = 0;
  unsigned	i;
  for(i = 0; i < nOutDim; ++i)
    {
      piOutMap[i] = piMap[i];
      if(piOutMap[i] > nMaxLag)
	nMaxLag = piOutMap[i];

      if(0 == i)
	nMinLag = piOutMap[i];
      if(piOutMap[i] < nMinLag)
	nMinLag = piOutMap[i];
    }
}